

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pedestrian.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_9219d::Pedestrian::annotatePathFollowing
          (Pedestrian *this,Vec3 *future,Vec3 *onPath,Vec3 *target,float outside)

{
  float fVar1;
  Vec3 VVar2;
  Color darkOrange;
  Color lightOrange;
  Color yellow;
  Color yellowOrange;
  Vec3 local_a8;
  Vec3 local_98;
  float local_88;
  Color local_70;
  Color local_60;
  Color local_50;
  Color local_40;
  
  local_88 = outside;
  OpenSteer::Color::Color(&local_50,1.0,1.0,0.0,1.0);
  OpenSteer::Color::Color(&local_60,1.0,0.5,0.0,1.0);
  OpenSteer::Color::Color(&local_70,0.6,0.3,0.0,1.0);
  fVar1 = 0.75;
  OpenSteer::Color::Color(&local_40,1.0,0.75,0.0,1.0);
  local_a8._0_8_ = (**(code **)(*(long *)this + 0x40))(this);
  local_a8.z = fVar1;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_a8,future,&local_50);
  local_a8._0_8_ = (**(code **)(*(long *)this + 0x40))(this);
  local_a8.z = fVar1;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_a8,target,&local_40);
  VVar2 = OpenSteer::Vec3::operator-(onPath,future);
  local_98.z = VVar2.z;
  local_98._0_8_ = VVar2._0_8_;
  VVar2 = OpenSteer::Vec3::normalize(&local_98);
  local_a8.z = VVar2.z * local_88;
  local_a8.y = local_88 * VVar2.y;
  local_a8.x = local_88 * VVar2.x;
  VVar2 = OpenSteer::Vec3::operator+(future,&local_a8);
  local_98.z = VVar2.z;
  local_98._0_8_ = VVar2._0_8_;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 onPath,&local_98,&local_70);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_98,future,&local_60);
  return;
}

Assistant:

void annotatePathFollowing (const Vec3& future,
                                    const Vec3& onPath,
                                    const Vec3& target,
                                    const float outside)
        {
            const Color yellow (1, 1, 0);
            const Color lightOrange (1.0f, 0.5f, 0.0f);
            const Color darkOrange  (0.6f, 0.3f, 0.0f);
            const Color yellowOrange (1.0f, 0.75f, 0.0f);

            // draw line from our position to our predicted future position
            annotationLine (position(), future, yellow);

            // draw line from our position to our steering target on the path
            annotationLine (position(), target, yellowOrange);

            // draw a two-toned line between the future test point and its
            // projection onto the path, the change from dark to light color
            // indicates the boundary of the tube.
            const Vec3 boundaryOffset = (onPath - future).normalize() * outside;
            const Vec3 onPathBoundary = future + boundaryOffset;
            annotationLine (onPath, onPathBoundary, darkOrange);
            annotationLine (onPathBoundary, future, lightOrange);
        }